

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctsa.c
# Opt level: O3

int ar_estimate(double *x,int N,int method)

{
  uint uVar1;
  double *x_00;
  ulong uVar2;
  uint uVar3;
  uint uVar4;
  double dVar5;
  double local_80;
  double loglik;
  double wmean;
  ulong local_68;
  double *local_60;
  double *local_58;
  double local_50;
  double var;
  double *local_40;
  uint local_38;
  uint local_34;
  
  local_34 = N;
  x_00 = (double *)malloc((long)N * 8);
  local_60 = (double *)malloc((long)N * 8);
  wmean = (double)N;
  dVar5 = log(wmean);
  local_68 = (ulong)(N - 1U);
  uVar1 = imin(N - 1U,(int)(dVar5 * 10.0));
  if (method == 2) {
    uVar1 = imin(uVar1,0xc);
  }
  uVar3 = local_34;
  loglik = mean(x,local_34);
  var = loglik;
  local_58 = (double *)malloc((long)(int)(uVar1 + 1) * (long)(int)(uVar1 + 1) * 8);
  local_40 = (double *)malloc((long)(int)uVar1 << 3);
  if (0 < (int)uVar3) {
    uVar2 = 0;
    do {
      x_00[uVar2] = x[uVar2] - var;
      uVar2 = uVar2 + 1;
    } while (local_34 != uVar2);
  }
  if (0 < (int)uVar1) {
    var = 0.0;
    uVar3 = 0;
    do {
      if (method == 1) {
        burgalg(x_00,(int)local_68,uVar3 + 1,local_40,&local_50);
      }
      else if (method == 0) {
        ywalg2(x_00,local_34,uVar3 + 1,local_40,&local_50);
      }
      else if (method == 2) {
        as154(x_00,local_34,7,uVar3 + 1,0,0,local_40,(double *)0x0,&loglik,&local_50,local_60,
              &local_80,local_58,0);
      }
      else {
        puts("\n The code only accepts numerical values 0,1 and 2 ");
        puts("\n Method 0 : Yule-Walker ");
        puts("\n Method 1 : Burg ");
        puts("\n Method 2 : MLE ");
      }
      uVar4 = uVar3 + 1;
      dVar5 = log(local_50);
      if (uVar3 == 0) {
        local_38 = 1;
      }
      else {
        dVar5 = (double)(uVar4 * 2) / wmean + dVar5;
        if (dVar5 < var) {
          var = dVar5;
          local_38 = uVar4;
        }
      }
      uVar3 = uVar4;
    } while (uVar4 != uVar1);
  }
  puts("\n");
  uVar1 = local_38;
  printf("AIC Estimate : p = %d \n",(ulong)local_38);
  free(x_00);
  free(local_60);
  free(local_58);
  free(local_40);
  return uVar1;
}

Assistant:

int ar_estimate(double *x, int N, int method) {
	int p, ordermax, logn, i;
	double wmean, aic, loglik, var, lvar, aic0,cssml;
	double *inp, *resid, *hess, *phi;

	inp = (double*)malloc(sizeof(double)* N);
	resid = (double*)malloc(sizeof(double)* N);

	logn = (int) (10.0 * log((double)N));
	ordermax = imin(N - 1, logn);

	if (method == 2) {
		ordermax = imin(ordermax, 12); // MLE
	}
	wmean = mean(x, N);
	aic0 = 0.0;
	cssml = 0;

	hess = (double*)malloc(sizeof(double)* (ordermax + 1) * (ordermax + 1));
	phi = (double*)malloc(sizeof(double)* ordermax);

	for (i = 0; i < N; ++i) {
		inp[i] = x[i] - wmean;
	}

	for (i = 0; i < ordermax; ++i) {
		if (method == 0) {
			ywalg2(inp, N, i + 1, phi, &var);
		}
		else if (method == 1) {
			burgalg(inp, N-1, i + 1, phi, &var);
		}
		else if (method == 2) {
			as154(inp, N, 7, i + 1, 0, 0, phi, NULL, &wmean, &var, resid, &loglik, hess,cssml);
		}
		else {
			printf("\n The code only accepts numerical values 0,1 and 2 \n");
			printf("\n Method 0 : Yule-Walker \n");
			printf("\n Method 1 : Burg \n");
			printf("\n Method 2 : MLE \n");
		}
		lvar = log(var);
		aic = lvar + 2 * (double)(i + 1) / N;
		if (i == 0) {
			aic = aic0;
			p = 1;
		}
		else {
			if (aic < aic0) {
				aic0 = aic;
				p = i + 1;
			}
		}
	}

	printf("\n\n");
	printf("AIC Estimate : p = %d \n", p);

	free(inp);
	free(resid);
	free(hess);
	free(phi);
	return p;
}